

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  void *pvVar2;
  void *pvVar3;
  Layer *pLVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int q;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  float fVar19;
  Mat bottom_blob_int8;
  ModelBinFromMatArray local_588;
  Mat weights [1];
  ParamDict pd;
  
  iVar9 = bottom_blob->w;
  iVar18 = bottom_blob->h;
  _c = bottom_blob->c;
  Mat::create(top_blob,this->num_output,bottom_blob->elemsize,opt->blob_allocator);
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar17 = iVar18 * iVar9;
    if (this->use_int8_inference == false) {
      uVar15 = 0;
      if (0 < (int)uVar17) {
        uVar15 = (ulong)uVar17;
      }
      uVar11 = 0;
      if (0 < (int)_c) {
        uVar11 = (ulong)_c;
      }
      iVar9 = 0;
      for (lVar13 = 0; lVar13 < this->num_output; lVar13 = lVar13 + 1) {
        if (this->bias_term == 0) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = *(float *)((long)(this->bias_data).data + lVar13 * 4);
        }
        lVar14 = (long)iVar9 << 2;
        for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
          pvVar2 = (this->weight_data).data;
          Mat::channel((Mat *)&pd,bottom_blob,(int)uVar16);
          uVar8 = pd._0_8_;
          Mat::~Mat((Mat *)&pd);
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            fVar19 = fVar19 + *(float *)((long)pvVar2 + uVar12 * 4 + lVar14) *
                              *(float *)(uVar8 + uVar12 * 4);
          }
          lVar14 = lVar14 + (long)(int)uVar17 * 4;
        }
        *(float *)((long)top_blob->data + lVar13 * 4) = fVar19;
        iVar9 = iVar9 + uVar17 * _c;
      }
      iVar10 = 0;
    }
    else {
      bottom_blob_int8.dims = 0;
      bottom_blob_int8.w = 0;
      bottom_blob_int8.h = 0;
      bottom_blob_int8.c = 0;
      bottom_blob_int8.elemsize = 0;
      bottom_blob_int8.allocator = (Allocator *)0x0;
      bottom_blob_int8.data = (void *)0x0;
      bottom_blob_int8.refcount = (int *)0x0;
      bottom_blob_int8.cstep = 0;
      Mat::create(&bottom_blob_int8,iVar9,iVar18,_c,1,opt->workspace_allocator);
      iVar10 = -100;
      if ((bottom_blob_int8.data != (void *)0x0) &&
         ((long)bottom_blob_int8.c * bottom_blob_int8.cstep != 0)) {
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,this->bottom_blob_int8_scale);
        (*this->quantize->_vptr_Layer[2])(this->quantize,&pd);
        (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob,&bottom_blob_int8);
        ParamDict::~ParamDict(&pd);
        iVar9 = 0;
        uVar15 = 0;
        if (0 < (int)uVar17) {
          uVar15 = (ulong)uVar17;
        }
        uVar11 = 0;
        if (0 < (int)_c) {
          uVar11 = (ulong)_c;
        }
        for (lVar13 = 0; lVar13 < this->num_output; lVar13 = lVar13 + 1) {
          lVar14 = (long)iVar9;
          pvVar2 = top_blob->data;
          iVar18 = 0;
          for (uVar16 = 0; sVar7 = bottom_blob_int8.cstep, sVar6 = bottom_blob_int8.elemsize,
              pvVar5 = bottom_blob_int8.data, uVar16 != uVar11; uVar16 = uVar16 + 1) {
            pvVar3 = (this->weight_data).data;
            pd._0_8_ = bottom_blob_int8.cstep * uVar16 * bottom_blob_int8.elemsize +
                       (long)bottom_blob_int8.data;
            pd.use_int8_inference = 0;
            pd._12_4_ = 0;
            pd.params[0].loaded = (undefined4)bottom_blob_int8.elemsize;
            pd.params[0].field_1 =
                 (anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1)
                 bottom_blob_int8.elemsize._4_4_;
            pd.params[0].v.data = bottom_blob_int8.allocator;
            pd.params[0].v.refcount._0_4_ = 2;
            pd.params[0].v.refcount._4_4_ = bottom_blob_int8.w;
            pd.params[0].v.elemsize._0_4_ = bottom_blob_int8.h;
            pd.params[0].v.elemsize._4_4_ = 1;
            pd.params[0].v.allocator = (Allocator *)(long)(bottom_blob_int8.h * bottom_blob_int8.w);
            Mat::~Mat((Mat *)&pd);
            for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
              iVar18 = iVar18 + (int)*(char *)((long)pvVar3 + uVar12 + lVar14) *
                                (int)*(char *)((long)pvVar5 + uVar12 + sVar7 * sVar6 * uVar16);
            }
            lVar14 = lVar14 + (int)uVar17;
          }
          *(int *)((long)pvVar2 + lVar13 * 4) = iVar18;
          iVar9 = iVar9 + uVar17 * _c;
        }
        fVar19 = this->weight_data_int8_scale;
        fVar1 = this->bottom_blob_int8_scale;
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,1.0 / (fVar19 * fVar1));
        ParamDict::set(&pd,1,this->bias_term);
        ParamDict::set(&pd,2,this->num_output);
        (*this->dequantize->_vptr_Layer[2])(this->dequantize,&pd);
        weights[0].dims = 0;
        weights[0].w = 0;
        weights[0].h = 0;
        weights[0].c = 0;
        weights[0].elemsize = 0;
        weights[0].allocator = (Allocator *)0x0;
        weights[0].data = (void *)0x0;
        weights[0].refcount = (int *)0x0;
        weights[0].cstep = 0;
        Mat::operator=(weights,&this->bias_data);
        pLVar4 = this->dequantize;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_588,weights);
        (*pLVar4->_vptr_Layer[3])(pLVar4,&local_588);
        (*this->dequantize->_vptr_Layer[7])(this->dequantize,top_blob,opt);
        Mat::~Mat(weights);
        ParamDict::~ParamDict(&pd);
        iVar10 = 0;
      }
      Mat::~Mat(&bottom_blob_int8);
    }
  }
  return iVar10;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->forward(bottom_blob, bottom_blob_int8, opt);
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_int8.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;
        }

        // dequantize, reverse scale inplace
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));

            dequantize->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = sum;
    }

    return 0;
}